

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_handling.hpp
# Opt level: O3

eAssertResult oqpi::assert_function(char *file,int line,char *expression,char *description,...)

{
  uint uVar1;
  char in_AL;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  uint __val;
  undefined8 in_R8;
  undefined8 in_R9;
  uint __len;
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string __str;
  string strMessage;
  va_list argPtr;
  allocator<char> local_269;
  long *local_268;
  undefined8 local_260;
  long local_258;
  undefined8 uStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  char *local_188;
  long local_180;
  char local_178;
  undefined7 uStack_177;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long *local_148 [2];
  long local_138 [2];
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_f8 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_188 = &local_178;
  local_180 = 0;
  local_178 = '\0';
  local_100 = &stack0x00000008;
  local_108 = 0x3000000020;
  local_c8 = in_R8;
  local_c0 = in_R9;
  vsnprintf((char *)(*in_FS_OFFSET + -0x400),0x400,description,&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_148,expression,&local_269);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_148,0,(char *)0x0,0x1c793c);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_158 = *plVar5;
    lStack_150 = plVar2[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *plVar5;
    local_168 = (long *)*plVar2;
  }
  local_160 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_208 = &local_1f8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1f8 = *plVar5;
    lStack_1f0 = plVar2[3];
  }
  else {
    local_1f8 = *plVar5;
    local_208 = (long *)*plVar2;
  }
  local_200 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_1e8 = &local_1d8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1d8 = *plVar5;
    lStack_1d0 = plVar2[3];
  }
  else {
    local_1d8 = *plVar5;
    local_1e8 = (long *)*plVar2;
  }
  local_1e0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = &local_1b8;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1b8 = *plVar5;
    lStack_1b0 = plVar2[3];
  }
  else {
    local_1b8 = *plVar5;
    local_1c8 = (long *)*plVar2;
  }
  local_1c0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = &local_198;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_198 = *plVar5;
    lStack_190 = plVar2[3];
  }
  else {
    local_198 = *plVar5;
    local_1a8 = (long *)*plVar2;
  }
  local_1a0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_238 = *puVar6;
    lStack_230 = plVar2[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *puVar6;
    local_248 = (ulong *)*plVar2;
  }
  local_240 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __val = -line;
  if (0 < line) {
    __val = line;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_0017536c;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_0017536c;
      }
      if (uVar4 < 10000) goto LAB_0017536c;
      uVar7 = uVar7 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_0017536c:
  local_228 = local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,(char)__len - (char)(line >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)line >> 0x1f) + (long)local_228),__len,__val);
  uVar7 = 0xf;
  if (local_248 != &local_238) {
    uVar7 = local_238;
  }
  if (uVar7 < (ulong)(local_220 + local_240)) {
    uVar7 = 0xf;
    if (local_228 != local_218) {
      uVar7 = local_218[0];
    }
    if ((ulong)(local_220 + local_240) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_248);
      goto LAB_001753f7;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228);
LAB_001753f7:
  local_268 = &local_258;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_258 = *plVar2;
    uStack_250 = puVar3[3];
  }
  else {
    local_258 = *plVar2;
    local_268 = (long *)*puVar3;
  }
  local_260 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_268);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_118 = *plVar5;
    lStack_110 = plVar2[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *plVar5;
    local_128 = (long *)*plVar2;
  }
  local_120 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_188,(string *)&local_128);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_188,local_180);
  if (local_188 != &local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
  return eAR_Retry;
}

Assistant:

inline eAssertResult assert_function(const char *file, int line, const char *expression, const char *description = "", ...)
    {
        std::string strMessage;

        va_list argPtr;
        static const unsigned int bufferSize = 1 << 10;
        thread_local static char formattedMessage[bufferSize];
        va_start(argPtr, description);
        vsnprintf(formattedMessage, bufferSize, description, argPtr);
        va_end(argPtr);


        strMessage = std::string(
            "*************************************************************************\n"
            "Assertion failed:\n"
            "=================\n"
            "[" + std::string(expression) + "]\n"
            "-------------------------------------------------------------------------\n"
            + formattedMessage + "\n"
            "-------------------------------------------------------------------------\n"
            + file + ", line " + std::to_string(line) + "\n\n"
            "*************************************************************************\n"
            "Stack trace:\n"
            "-------------------------------------------------------------------------\n");

#if OQPI_PLATFORM_WIN
        eAssertResult assertResult = eAR_Ignore;
        int result = MessageBoxA(0, strMessage.c_str(), "Assertion Failed", MB_ABORTRETRYIGNORE);
        switch (result)
        {
        case IDABORT:
            assertResult = eAR_Abort;
            exit(1);
            break;

        case IDRETRY:
            assertResult = eAR_Retry;
            break;

        case IDIGNORE:
            assertResult = (GetAsyncKeyState(VK_SHIFT) & 0x8000) ? eAR_AlwaysIgnore : eAR_Ignore;
            break;
        }

        return assertResult;

#else
        std::cout << strMessage;
        return eAR_Retry;
#endif // OQPI_PLATFORM_WIN
    }